

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

void qt_QMetaEnum_flagDebugOperator<unsigned_long_long>
               (QDebug *debug,size_t sizeofT,unsigned_long_long value)

{
  long lVar1;
  QDebugStateSaver *this;
  QDebug *in_RDX;
  long in_RSI;
  QDebug *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  size_t i;
  bool needSeparator;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  QDebug *in_stack_ffffffffffffffb0;
  undefined8 local_40;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  QDebugStateSaver *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebugStateSaver::QDebugStateSaver
            (in_stack_ffffffffffffffd0,
             (QDebug *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  QDebug::resetFormat(in_stack_ffffffffffffffb0);
  QDebug::nospace(in_RDI);
  QDebug::operator<<(in_RDX,in_stack_00000008);
  this = (QDebugStateSaver *)
         QDebug::operator<<(in_stack_ffffffffffffffb0,
                            (QTextStreamFunction)
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  QDebug::operator<<((QDebug *)this,
                     (QTextStreamFunction)
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  uVar2 = 0;
  for (local_40 = 0; local_40 < (ulong)(in_RSI << 3); local_40 = local_40 + 1) {
    if (((ulong)in_RDX & 1L << ((byte)local_40 & 0x3f)) != 0) {
      if ((uVar2 & 0x1000000) == 0) {
        uVar2 = 0x1000000;
      }
      else {
        QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffaf);
      }
      QDebug::operator<<((QDebug *)this,
                         CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
  }
  QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffaf);
  QDebugStateSaver::~QDebugStateSaver(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_QMetaEnum_flagDebugOperator(QDebug &debug, size_t sizeofT, Int value)
{
    static_assert(std::is_unsigned_v<Int>,
            "Cast value to an unsigned type before calling this function");
    const QDebugStateSaver saver(debug);
    debug.resetFormat();
    debug.nospace() << "QFlags(" << Qt::hex << Qt::showbase;
    bool needSeparator = false;
    for (size_t i = 0; i < sizeofT * 8; ++i) {
        if (value & (Int(1) << i)) {
            if (needSeparator)
                debug << '|';
            else
                needSeparator = true;
            debug << (Int(1) << i);
        }
    }
    debug << ')';
}